

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

void __thiscall
Hospital::Update_Nurse_File
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,ofstream *inFile)

{
  ostream *poVar1;
  ulong uVar2;
  pointer pNVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ofstream abus;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  system("pause");
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x129170);
  pNVar3 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
      super__Vector_impl_data._M_finish != pNVar3) {
    uVar2 = 0;
    do {
      lVar5 = 8;
      uVar4 = 0;
      while( true ) {
        Nurse::nurse_all_ino_getter_abi_cxx11_(&local_248,pNVar3 + uVar2);
        lVar6 = (long)local_248.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_248.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        if ((ulong)(lVar6 >> 5) <= uVar4) break;
        Nurse::nurse_all_ino_getter_abi_cxx11_
                  (&local_248,
                   (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar2);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,
                            *(char **)((long)local_248.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8)
                            ,*(long *)((long)&((local_248.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        uVar4 = uVar4 + 1;
        pNVar3 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
      uVar2 = uVar2 + 1;
      pNVar3 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar3 >> 3) * -0x7d05f417d05f417d;
    } while (uVar2 <= uVar4 && uVar4 - uVar2 != 0);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Hospital:: Update_Nurse_File (vector<Nurse>& All_Of_Nurses , ofstream& inFile) {
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Nurses.txt");
    //abus <<"Asghar";

    for (int i = 0; i < All_Of_Nurses.size(); i++) {
        for (int j = 0; j < All_Of_Nurses[i].nurse_all_ino_getter().size(); ++j) {
            abus << All_Of_Nurses[i].nurse_all_ino_getter()[j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}